

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall llvm::APInt::dump(APInt *this)

{
  raw_ostream *prVar1;
  SmallString<40U> U;
  SmallString<40U> S;
  
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = &S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>
  ;
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  S.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  U.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = &U.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>
  ;
  U.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  U.super_SmallVector<char,_40U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x28;
  toStringUnsigned(this,(SmallVectorImpl<char> *)&U,10);
  toStringSigned(this,(SmallVectorImpl<char> *)&S,10);
  prVar1 = dbgs();
  prVar1 = raw_ostream::operator<<(prVar1,"APInt(");
  prVar1 = raw_ostream::operator<<(prVar1,(ulong)this->BitWidth);
  prVar1 = raw_ostream::operator<<(prVar1,"b, ");
  prVar1 = raw_ostream::operator<<(prVar1,(SmallVectorImpl<char> *)&U);
  prVar1 = raw_ostream::operator<<(prVar1,"u ");
  prVar1 = raw_ostream::operator<<(prVar1,(SmallVectorImpl<char> *)&S);
  raw_ostream::operator<<(prVar1,"s)\n");
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&U);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&S);
  return;
}

Assistant:

LLVM_DUMP_METHOD void APInt::dump() const {
  SmallString<40> S, U;
  this->toStringUnsigned(U);
  this->toStringSigned(S);
  dbgs() << "APInt(" << BitWidth << "b, "
         << U << "u " << S << "s)\n";
}